

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O3

CK_RV __thiscall SoftHSM::C_Logout(SoftHSM *this,CK_SESSION_HANDLE hSession)

{
  CK_RV CVar1;
  Session *this_00;
  Token *this_01;
  Slot *this_02;
  CK_SLOT_ID slotID;
  
  CVar1 = 400;
  if (this->isInitialised == true) {
    this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
    if (this_00 == (Session *)0x0) {
      CVar1 = 0xb3;
    }
    else {
      this_01 = Session::getToken(this_00);
      if (this_01 == (Token *)0x0) {
        CVar1 = 5;
      }
      else {
        Token::logout(this_01);
        this_02 = Session::getSlot(this_00);
        slotID = Slot::getSlotID(this_02);
        HandleManager::tokenLoggedOut(this->handleManager,slotID);
        SessionObjectStore::tokenLoggedOut(this->sessionObjectStore,slotID);
        CVar1 = 0;
      }
    }
  }
  return CVar1;
}

Assistant:

CK_RV SoftHSM::C_Logout(CK_SESSION_HANDLE hSession)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL) return CKR_GENERAL_ERROR;

	// Logout
	token->logout();

	// [PKCS#11 v2.40, C_Logout] When logout is successful...
	// a. Any of the application's handles to private objects become invalid.
	// b. Even if a user is later logged back into the token those handles remain invalid.
	// c. All private session objects from sessions belonging to the application are destroyed.

	// Have the handle manager remove all handles pointing to private objects for this slot.
	CK_SLOT_ID slotID = session->getSlot()->getSlotID();
	handleManager->tokenLoggedOut(slotID);
	sessionObjectStore->tokenLoggedOut(slotID);

	return CKR_OK;
}